

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetReissuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *asset_blind_nonce_list,BlindFactor *asset_blind_factor,BlindFactor *entropy)

{
  undefined8 uVar1;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *pvVar2;
  uint32_t tx_in_index_00;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  size_t sVar6;
  int64_t iVar7;
  CfdException *pCVar8;
  uchar *puVar9;
  size_type sVar10;
  uchar *puVar11;
  size_type sVar12;
  const_reference object;
  const_reference value;
  const_reference locking_script;
  bool bVar13;
  Amount AVar14;
  undefined1 local_450 [8];
  ConfidentialNonce nonce;
  size_t index;
  ByteData local_408;
  ConfidentialValue local_3f0;
  ConfidentialValue local_3c8;
  ByteData256 local_3a0;
  ByteData256 local_388;
  ByteData local_370;
  ConfidentialAssetId local_358;
  undefined1 local_32b;
  undefined1 local_32a;
  allocator local_329;
  string local_328;
  CfdSourceLocation local_308;
  ByteData256 local_2f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2d8;
  ByteData256 local_2c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  int local_290;
  allocator<unsigned_char> local_289;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset;
  string local_268;
  CfdSourceLocation local_248;
  reference local_230;
  Script *script;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *__range3_1;
  string local_208;
  CfdSourceLocation local_1e8;
  int64_t local_1d0;
  undefined1 local_1c8;
  reference local_1c0;
  Amount *amount;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range3;
  Amount total;
  string local_188;
  CfdSourceLocation local_168;
  undefined1 local_14a;
  allocator local_149;
  string local_148;
  CfdSourceLocation local_128;
  undefined1 local_10a;
  allocator local_109;
  string local_108;
  CfdSourceLocation local_e8;
  byte local_ca;
  byte local_c9;
  ConfidentialValue local_c8;
  ByteData local_a0;
  ConfidentialValue local_78;
  ByteData local_50;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *local_38;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list_local;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list_local;
  Amount *asset_amount_local;
  ConfidentialTransaction *pCStack_18;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  IssuanceParameter *param;
  
  local_38 = asset_locking_script_list;
  asset_locking_script_list_local =
       (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)asset_output_amount_list;
  asset_output_amount_list_local =
       (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)asset_amount;
  asset_amount_local._4_4_ = tx_in_index;
  pCStack_18 = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x7c8,"SetAssetReissuance");
  pvVar5 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ::operator[](&this->vin_,(ulong)asset_amount_local._4_4_);
  ConfidentialTxIn::GetInflationKeys(&local_78,pvVar5);
  local_c9 = 0;
  local_ca = 0;
  ConfidentialValue::GetData(&local_50,&local_78);
  sVar6 = ByteData::GetDataSize(&local_50);
  bVar13 = true;
  if (sVar6 == 0) {
    pvVar5 = ::std::
             vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
             operator[](&this->vin_,(ulong)asset_amount_local._4_4_);
    ConfidentialTxIn::GetIssuanceAmount(&local_c8,pvVar5);
    local_c9 = 1;
    ConfidentialValue::GetData(&local_a0,&local_c8);
    local_ca = 1;
    sVar6 = ByteData::GetDataSize(&local_a0);
    bVar13 = sVar6 != 0;
  }
  if ((local_ca & 1) != 0) {
    ByteData::~ByteData(&local_a0);
  }
  if ((local_c9 & 1) != 0) {
    ConfidentialValue::~ConfidentialValue(&local_c8);
  }
  ByteData::~ByteData(&local_50);
  ConfidentialValue::~ConfidentialValue(&local_78);
  if (bVar13) {
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x7cc;
    local_e8.funcname = "SetAssetReissuance";
    logger::warn<>(&local_e8,"already set to reissue parameter");
    local_10a = 1;
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_108,"already set to reissue parameter",&local_109);
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,&local_108);
    local_10a = 0;
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar7 = Amount::GetSatoshiValue((Amount *)asset_output_amount_list_local);
  if (iVar7 < 1) {
    local_128.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_128.filename = local_128.filename + 1;
    local_128.line = 0x7d2;
    local_128.funcname = "SetAssetReissuance";
    logger::warn<>(&local_128,"ReIssuance must have one non-zero amount.");
    local_14a = 1;
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_148,"ReIssuance must have one non-zero amount.",&local_149);
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,&local_148);
    local_14a = 0;
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar13 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                     ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                      asset_locking_script_list_local);
  bVar3 = ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::empty(local_38);
  if (bVar13 != bVar3) {
    local_168.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_168.filename = local_168.filename + 1;
    local_168.line = 0x7d8;
    local_168.funcname = "SetAssetReissuance";
    logger::warn<>(&local_168,"Unmatch count. asset amount list and locking script list.");
    total._14_1_ = 1;
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_188,"Unmatch count. asset amount list and locking script list.",
               (allocator *)&total.field_0xf);
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,&local_188);
    total._14_1_ = 0;
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar13 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                     ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                      asset_locking_script_list_local);
  if (!bVar13) {
    Amount::Amount((Amount *)&__range3);
    pvVar2 = asset_locking_script_list_local;
    __end3 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::begin
                       ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                        asset_locking_script_list_local);
    amount = (Amount *)
             ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::end
                       ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)pvVar2);
    while (bVar13 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                                        *)&amount), bVar13) {
      local_1c0 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                  ::operator*(&__end3);
      AVar14 = Amount::operator+=((Amount *)&__range3,local_1c0);
      local_1d0 = AVar14.amount_;
      local_1c8 = AVar14.ignore_check_;
      __gnu_cxx::
      __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
      ::operator++(&__end3);
    }
    bVar13 = Amount::operator!=((Amount *)&__range3,(Amount *)asset_output_amount_list_local);
    pvVar2 = local_38;
    if (bVar13) {
      local_1e8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_1e8.filename = local_1e8.filename + 1;
      local_1e8.line = 0x7e4;
      local_1e8.funcname = "SetAssetReissuance";
      logger::warn<>(&local_1e8,"Unmatch asset amount.");
      __range3_1._6_1_ = 1;
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_208,"Unmatch asset amount.",(allocator *)((long)&__range3_1 + 7));
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,&local_208);
      __range3_1._6_1_ = 0;
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __end3_1 = ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::begin(local_38)
    ;
    script = (Script *)
             ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::end(pvVar2);
    while (bVar13 = __gnu_cxx::operator!=
                              (&__end3_1,
                               (__normal_iterator<const_cfd::core::Script_*,_std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>_>
                                *)&script), bVar13) {
      local_230 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::Script_*,_std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>_>
                  ::operator*(&__end3_1);
      bVar13 = Script::IsEmpty(local_230);
      if (bVar13) {
        local_248.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_248.filename = local_248.filename + 1;
        local_248.line = 0x7e9;
        local_248.funcname = "SetAssetReissuance";
        logger::warn<>(&local_248,"Empty locking script from asset.");
        asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_268,"Empty locking script from asset.",
                   (allocator *)
                   ((long)&asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,&local_268);
        asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::Script_*,_std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>_>
      ::operator++(&__end3_1);
    }
  }
  ::std::allocator<unsigned_char>::allocator(&local_289);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0x20,&local_289);
  ::std::allocator<unsigned_char>::~allocator(&local_289);
  BlindFactor::GetData(&local_2c0,entropy);
  ByteData256::GetBytes(&local_2a8,&local_2c0);
  puVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8);
  BlindFactor::GetData(&local_2f0,entropy);
  ByteData256::GetBytes(&local_2d8,&local_2f0);
  sVar10 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2d8);
  puVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  sVar12 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  iVar4 = wally_tx_elements_issuance_calculate_asset(puVar9,sVar10,puVar11,sVar12);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2d8);
  ByteData256::~ByteData256(&local_2f0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8);
  ByteData256::~ByteData256(&local_2c0);
  local_290 = iVar4;
  if (iVar4 != 0) {
    local_308.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_308.filename = local_308.filename + 1;
    local_308.line = 0x7f6;
    local_308.funcname = "SetAssetReissuance";
    logger::warn<int&>(&local_308,"wally_tx_elements_issuance_calculate_asset NG[{}].",&local_290);
    local_32a = 1;
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_328,"asset calculate error.",&local_329);
    CfdException::CfdException(pCVar8,kCfdIllegalStateError,&local_328);
    local_32a = 0;
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_32b = 0;
  IssuanceParameter::IssuanceParameter(__return_storage_ptr__);
  BlindFactor::operator=(&__return_storage_ptr__->entropy,entropy);
  ByteData::ByteData(&local_370,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ConfidentialAssetId::ConfidentialAssetId(&local_358,&local_370);
  ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_358);
  ConfidentialAssetId::~ConfidentialAssetId(&local_358);
  ByteData::~ByteData(&local_370);
  tx_in_index_00 = asset_amount_local._4_4_;
  BlindFactor::GetData(&local_388,asset_blind_factor);
  BlindFactor::GetData(&local_3a0,entropy);
  ConfidentialValue::ConfidentialValue(&local_3c8,(Amount *)asset_output_amount_list_local);
  ConfidentialValue::ConfidentialValue(&local_3f0);
  ByteData::ByteData(&local_408);
  ByteData::ByteData((ByteData *)&index);
  SetIssuance(this,tx_in_index_00,&local_388,&local_3a0,&local_3c8,&local_3f0,&local_408,
              (ByteData *)&index);
  ByteData::~ByteData((ByteData *)&index);
  ByteData::~ByteData(&local_408);
  ConfidentialValue::~ConfidentialValue(&local_3f0);
  ConfidentialValue::~ConfidentialValue(&local_3c8);
  ByteData256::~ByteData256(&local_3a0);
  ByteData256::~ByteData256(&local_388);
  bVar13 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                     ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                      asset_locking_script_list_local);
  if ((!bVar13) &&
     (iVar7 = Amount::GetSatoshiValue((Amount *)asset_output_amount_list_local), 0 < iVar7)) {
    nonce.version_ = '\0';
    nonce._33_7_ = 0;
    for (; uVar1 = nonce._32_8_,
        sVar10 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::size
                           ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                            asset_locking_script_list_local), (ulong)uVar1 < sVar10;
        nonce._32_8_ = nonce._32_8_ + 1) {
      ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_450);
      uVar1 = nonce._32_8_;
      sVar10 = ::std::
               vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
               size(asset_blind_nonce_list);
      if ((ulong)uVar1 < sVar10) {
        object = ::std::
                 vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                 ::operator[](asset_blind_nonce_list,nonce._32_8_);
        ConfidentialNonce::operator=((ConfidentialNonce *)local_450,object);
      }
      value = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::operator[]
                        ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                         asset_locking_script_list_local,nonce._32_8_);
      locking_script =
           ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                     (local_38,nonce._32_8_);
      AddTxOut(this,value,&__return_storage_ptr__->asset,locking_script,
               (ConfidentialNonce *)local_450);
      ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_450);
    }
  }
  local_32b = 1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetReissuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const std::vector<Amount> &asset_output_amount_list,
    const std::vector<Script> &asset_locking_script_list,
    const std::vector<ConfidentialNonce> &asset_blind_nonce_list,
    const BlindFactor &asset_blind_factor, const BlindFactor &entropy) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  if ((vin_[tx_in_index].GetInflationKeys().GetData().GetDataSize() > 0) ||
      (vin_[tx_in_index].GetIssuanceAmount().GetData().GetDataSize() > 0)) {
    warn(CFD_LOG_SOURCE, "already set to reissue parameter");
    throw CfdException(
        kCfdIllegalArgumentError, "already set to reissue parameter");
  }

  if (asset_amount.GetSatoshiValue() <= 0) {
    warn(CFD_LOG_SOURCE, "ReIssuance must have one non-zero amount.");
    throw CfdException(
        kCfdIllegalArgumentError, "ReIssuance must have one non-zero amount.");
  }
  if (asset_output_amount_list.empty() != asset_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. asset amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. asset amount list and locking script list.");
  }
  if (!asset_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : asset_output_amount_list) {
      total += amount;
    }
    if (total != asset_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch asset amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch asset amount.");
    }
    for (const auto &script : asset_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from asset.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from asset.");
      }
    }
  }

  std::vector<uint8_t> asset(kAssetSize);
  int ret = wally_tx_elements_issuance_calculate_asset(
      entropy.GetData().GetBytes().data(), entropy.GetData().GetBytes().size(),
      asset.data(), asset.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_issuance_calculate_asset NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "asset calculate error.");
  }

  IssuanceParameter param;
  param.entropy = entropy;
  param.asset = ConfidentialAssetId(ByteData(asset));
  SetIssuance(
      tx_in_index, asset_blind_factor.GetData(), entropy.GetData(),
      ConfidentialValue(asset_amount), ConfidentialValue(), ByteData(),
      ByteData());

  if ((!asset_output_amount_list.empty()) &&
      (asset_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < asset_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < asset_blind_nonce_list.size()) {
        nonce = asset_blind_nonce_list[index];
      }
      AddTxOut(
          asset_output_amount_list[index], param.asset,
          asset_locking_script_list[index], nonce);
    }
  }
  return param;
}